

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

int Gia_ManConstructFromMap
              (Gia_Man_t *pNew,Vec_Int_t *vGates,int nVars,Vec_Int_t *vUsed,Vec_Int_t *vCopy,
              int fHash)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  
  uVar1 = vGates->nSize;
  uVar4 = (ulong)(int)uVar1;
  if ((long)uVar4 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  if (vUsed->nSize != nVars) {
    __assert_fail("Vec_IntSize(vUsed) == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x20f,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if (uVar1 == 1) {
    __assert_fail("Vec_IntSize(vGates) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x210,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if ((uVar4 & 1) == 0) {
    __assert_fail("Vec_IntSize(vGates) % 2 == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                  ,0x211,
                  "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  if (-1 < vGates->pArray[uVar4 - 1]) {
    if (((uint)vGates->pArray[uVar4 - 1] >> 1) - nVars != (uVar1 >> 1) - 1) {
      __assert_fail("Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(vGates)/2-1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                    ,0x212,
                    "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                   );
    }
    vCopy->nSize = 0;
    iVar3 = vGates->nSize;
    if (iVar3 < 2) {
LAB_0079192a:
      if (vCopy->nSize != iVar3 / 2) {
        __assert_fail("Vec_IntSize(vCopy) == Vec_IntSize(vGates)/2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                      ,0x22d,
                      "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                     );
      }
      if (1 < iVar3) {
        return vCopy->pArray[(ulong)(uint)(iVar3 / 2) - 1];
      }
LAB_0079195a:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    lVar10 = 1;
    while( true ) {
      uVar1 = vGates->pArray[lVar10 + -1];
      if (((int)uVar1 < 0) || (uVar2 = vGates->pArray[lVar10], (int)uVar2 < 0)) break;
      uVar7 = uVar1 >> 1;
      uVar5 = uVar7 - nVars;
      if ((int)uVar7 < nVars) {
        pVVar9 = vUsed;
        uVar5 = uVar7;
        if (vUsed->nSize <= (int)uVar7) goto LAB_0079195a;
      }
      else if (((int)uVar5 < 0) || (pVVar9 = vCopy, vCopy->nSize <= (int)uVar5)) goto LAB_0079195a;
      uVar8 = uVar2 >> 1;
      uVar5 = pVVar9->pArray[uVar5];
      uVar6 = uVar8 - nVars;
      if ((int)uVar8 < nVars) {
        pVVar9 = vUsed;
        uVar6 = uVar8;
        if (vUsed->nSize <= (int)uVar8) goto LAB_0079195a;
      }
      else if (((int)uVar6 < 0) || (pVVar9 = vCopy, vCopy->nSize <= (int)uVar6)) goto LAB_0079195a;
      uVar6 = pVVar9->pArray[uVar6];
      if (uVar7 < uVar8) {
        if (fHash == 0) {
          if (((int)uVar5 < 0) || ((int)uVar6 < 0)) goto LAB_00791979;
          uVar1 = Gia_ManAppendAnd(pNew,uVar5 ^ uVar1 & 1,uVar6 ^ uVar2 & 1);
        }
        else {
          if (((int)uVar5 < 0) || ((int)uVar6 < 0)) goto LAB_00791979;
          uVar1 = Gia_ManHashAnd(pNew,uVar5 ^ uVar1 & 1,uVar6 ^ uVar2 & 1);
        }
      }
      else {
        if (uVar7 <= uVar8) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                        ,0x22a,
                        "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        if ((uVar1 & 1) != 0) {
          __assert_fail("!Abc_LitIsCompl(iLit0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                        ,0x223,
                        "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        if ((uVar2 & 1) != 0) {
          __assert_fail("!Abc_LitIsCompl(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                        ,0x224,
                        "int Gia_ManConstructFromMap(Gia_Man_t *, Vec_Int_t *, int, Vec_Int_t *, Vec_Int_t *, int)"
                       );
        }
        if (fHash == 0) {
          if (((int)uVar5 < 0) || ((int)uVar6 < 0)) {
LAB_00791979:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar1 = Gia_ManAppendAnd(pNew,uVar5 ^ 1,uVar6);
          uVar2 = Gia_ManAppendAnd(pNew,uVar5,uVar6 ^ 1);
          if (((int)uVar1 < 0) || ((int)uVar2 < 0)) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x131,"int Abc_LitNot(int)");
          }
          uVar1 = Gia_ManAppendAnd(pNew,uVar1 ^ 1,uVar2 ^ 1);
          if ((int)uVar1 < 0) goto LAB_00791979;
          uVar1 = uVar1 ^ 1;
        }
        else {
          if (((int)uVar5 < 0) || ((int)uVar6 < 0)) goto LAB_00791979;
          uVar1 = Gia_ManHashXor(pNew,uVar5,uVar6);
        }
      }
      Vec_IntPush(vCopy,uVar1);
      iVar3 = vGates->nSize;
      lVar10 = lVar10 + 2;
      if (iVar3 <= (int)lVar10) goto LAB_0079192a;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                ,0x12f,"int Abc_Lit2Var(int)");
}

Assistant:

int Gia_ManConstructFromMap( Gia_Man_t * pNew, Vec_Int_t * vGates, int nVars, Vec_Int_t * vUsed, Vec_Int_t * vCopy, int fHash )
{
    int i, iLit0, iLit1, iLitRes, iTopLit = Vec_IntEntryLast( vGates );
    assert( Vec_IntSize(vUsed) == nVars );
    assert( Vec_IntSize(vGates) > 1 );
    assert( Vec_IntSize(vGates) % 2 == 1 );
    assert( Abc_Lit2Var(iTopLit)-nVars == Vec_IntSize(vGates)/2-1 );
    Vec_IntClear( vCopy );
    Vec_IntForEachEntryDouble( vGates, iLit0, iLit1, i )
    {
        int iVar0 = Abc_Lit2Var(iLit0);
        int iVar1 = Abc_Lit2Var(iLit1);
        int iRes0 = iVar0 < nVars ? Vec_IntEntry(vUsed, iVar0) : Vec_IntEntry(vCopy, iVar0 - nVars);
        int iRes1 = iVar1 < nVars ? Vec_IntEntry(vUsed, iVar1) : Vec_IntEntry(vCopy, iVar1 - nVars);
        if ( iVar0 < iVar1 )
        {
            if ( fHash )
                iLitRes = Gia_ManHashAnd( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
            else
                iLitRes = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
        }
        else if ( iVar0 > iVar1 )
        {
            assert( !Abc_LitIsCompl(iLit0) );
            assert( !Abc_LitIsCompl(iLit1) );
            if ( fHash )
                iLitRes = Gia_ManHashXor( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
            else
                iLitRes = Gia_ManAppendXor( pNew, Abc_LitNotCond(iRes0, Abc_LitIsCompl(iLit0)), Abc_LitNotCond(iRes1, Abc_LitIsCompl(iLit1)) );
        }
        else assert( 0 );
        Vec_IntPush( vCopy, iLitRes );
    }
    assert( Vec_IntSize(vCopy) == Vec_IntSize(vGates)/2 );
    iLitRes = Vec_IntEntry( vCopy, Vec_IntSize(vGates)/2-1 );
    return iLitRes;
}